

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::
get_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
          (GeomPrimvar *this,
          vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *dest,string *err
          )

{
  Attribute *this_00;
  vtable_type *pvVar1;
  pointer pSVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint32_t uVar6;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *__x;
  undefined8 in_RCX;
  undefined8 this_01;
  PrimVar *pPVar7;
  anon_struct_8_0_00000001_for___align aVar8;
  anon_struct_8_0_00000001_for___align aVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool bVar10;
  bool bVar11;
  optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_> pv;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a8;
  string local_98;
  undefined1 local_74 [4];
  string local_70;
  string local_50;
  
  aVar8 = (anon_struct_8_0_00000001_for___align)local_b8;
  if (dest == (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)0x0) {
joined_r0x001bf5cd:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar10 = false;
      }
      else {
        uVar6 = (*pvVar1->type_id)();
        bVar10 = uVar6 == 4;
      }
      if ((bVar10) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x001bf5cd;
    }
    if (((this->_attr)._var._blocked == false) &&
       (((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar1->type_id)(), uVar6 == 0)) ||
        ((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar1->type_id)(), uVar6 == 1)))))) {
      if ((this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar11 = (this->_attr)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 (this->_attr)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar10 = !bVar11;
        if (bVar11) {
          if (err == (string *)0x0) {
            return bVar10;
          }
          std::__cxx11::string::append((char *)err);
          return bVar10;
        }
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
        }
        pSVar2 = (this->_attr)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish == pSVar2) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        __x = tinyusdz::value::Value::
              as<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                        (&pSVar2->value,false);
        if (__x != (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)0x0)
        {
          std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::operator=
                    (dest,__x);
          return bVar10;
        }
      }
    }
    else {
      this_00 = &this->_attr;
      uVar6 = Attribute::type_id(this_00);
      bVar10 = IsSupportedGeomPrimvarType(uVar6);
      if (bVar10) {
        this_01 = &(this->_attr)._var;
        primvar::PrimVar::
        get_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                  ((optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                    *)local_b8,(PrimVar *)this_01);
        uVar5 = aStack_a8._8_8_;
        uVar4 = aStack_a8._M_allocated_capacity;
        uVar3 = local_b8._8_8_;
        if (local_b8[0] == true) {
          local_b8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          aStack_a8._M_allocated_capacity = 0;
          aStack_a8._8_8_ = (PrimVar *)0x0;
          in_RCX = uVar4;
          this_01 = uVar5;
          aVar8 = (anon_struct_8_0_00000001_for___align)uVar3;
        }
        pPVar7 = (PrimVar *)this_01;
        aVar9 = aVar8;
        if (local_b8[0] != false) {
          pPVar7 = (PrimVar *)0x0;
          aVar9 = (anon_struct_8_0_00000001_for___align)0x0;
          local_b8._8_8_ = aVar8;
          aStack_a8._M_allocated_capacity = in_RCX;
          aStack_a8._8_8_ = this_01;
        }
        if ((local_b8[0] & aVar9 != (anon_struct_8_0_00000001_for___align)0x0) == 1) {
          operator_delete((void *)aVar9,(long)pPVar7 - (long)aVar9);
        }
        bVar10 = local_b8[0];
        if (local_b8[0] == true) {
          std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::operator=
                    (dest,(vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                           *)(local_b8 + 8));
        }
        else if (err != (string *)0x0) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,
                     "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`"
                     ,"");
          local_74 = (undefined1  [4])0x10002b;
          Attribute::type_name_abi_cxx11_(&local_50,this_00);
          fmt::format<unsigned_int,std::__cxx11::string>
                    ((string *)(local_74 + 4),(fmt *)&local_98,(string *)local_74,(uint *)&local_50,
                     in_R8);
          std::__cxx11::string::_M_append((char *)err,(ulong)local_70._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_b8[0] != true) {
          return bVar10;
        }
        if ((anon_struct_8_0_00000001_for___align)local_b8._8_8_ ==
            (anon_struct_8_0_00000001_for___align)0x0) {
          return bVar10;
        }
        operator_delete((void *)local_b8._8_8_,aStack_a8._8_8_ - local_b8._8_8_);
        return bVar10;
      }
      if (err != (string *)0x0) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_74 + 4),"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_(&local_98,this_00);
        fmt::format<std::__cxx11::string>
                  ((string *)local_b8,(fmt *)(local_74 + 4),&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
        std::__cxx11::string::_M_append((char *)err,CONCAT71(local_b8._1_7_,local_b8[0]));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_b8._1_7_,local_b8[0]) != &aStack_a8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_b8._1_7_,local_b8[0]),
                          (ulong)(aStack_a8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._0_8_ + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}